

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O0

void __thiscall CGL::GLScene::AreaLight::render_debugger_node(AreaLight *this)

{
  bool bVar1;
  void *in_RDI;
  float in_stack_ffffffffffffffe4;
  float v_speed;
  int in_stack_ffffffffffffffe8;
  int iVar2;
  int in_stack_ffffffffffffffec;
  int iVar3;
  int in_stack_fffffffffffffff0;
  int iVar4;
  int iVar5;
  
  bVar1 = ImGui::TreeNode(in_RDI,"Area Light");
  if (bVar1) {
    iVar5 = 0;
    Vector3D::operator[]((Vector3D *)((long)in_RDI + 0x10),(int *)&stack0xfffffffffffffff4);
    DragDouble3((char *)CONCAT44(iVar5,in_stack_fffffffffffffff0),
                (double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                in_stack_ffffffffffffffe4);
    iVar4 = 0;
    Vector3D::operator[]((Vector3D *)((long)in_RDI + 0x30),(int *)&stack0xfffffffffffffff0);
    DragDouble3((char *)CONCAT44(iVar5,iVar4),
                (double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                in_stack_ffffffffffffffe4);
    iVar3 = 0;
    Vector3D::operator[]((Vector3D *)((long)in_RDI + 0x50),(int *)&stack0xffffffffffffffec);
    DragDouble3((char *)CONCAT44(iVar5,iVar4),(double *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                in_stack_ffffffffffffffe4);
    iVar2 = 0;
    Vector3D::operator[]((Vector3D *)((long)in_RDI + 0x70),(int *)&stack0xffffffffffffffe8);
    DragDouble3((char *)CONCAT44(iVar5,iVar4),(double *)CONCAT44(iVar3,iVar2),
                in_stack_ffffffffffffffe4);
    v_speed = 0.0;
    Vector3D::operator[]((Vector3D *)((long)in_RDI + 0x90),(int *)&stack0xffffffffffffffe4);
    DragDouble3((char *)CONCAT44(iVar5,iVar4),(double *)CONCAT44(iVar3,iVar2),v_speed);
    ImGui::TreePop();
  }
  return;
}

Assistant:

void render_debugger_node() {
    if (ImGui::TreeNode(this, "Area Light"))
    {
      DragDouble3("Radiance", &spectrum[0], 0.005);
      DragDouble3("Position", &position[0], 0.005);
      DragDouble3("Direction", &direction[0], 0.005);
      DragDouble3("Dimension X", &dim_x[0], 0.005);
      DragDouble3("Dimension Y", &dim_y[0], 0.005);
      ImGui::TreePop();
    }
  }